

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

string * __thiscall
fmt::v10::vformat_abi_cxx11_
          (string *__return_storage_ptr__,v10 *this,string_view fmt,format_args args)

{
  basic_string_view<char> fmt_00;
  type args_00;
  memory_buffer buffer;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_220;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
        )args.desc_;
  args_00.desc_ = fmt.size_;
  fmt_00.size_ = fmt.data_;
  local_220.super_buffer<char>.ptr_ = local_220.store_;
  local_220.super_buffer<char>.size_ = 0;
  local_220.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_003489f8;
  local_220.super_buffer<char>.capacity_ = 500;
  fmt_00.data_ = (char *)this;
  detail::vformat_to<char>(&local_220.super_buffer<char>,fmt_00,args_00,(locale_ref)0x0);
  to_string<char,500ul>(__return_storage_ptr__,(v10 *)&local_220,buf);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&local_220);
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC auto vformat(string_view fmt, format_args args) -> std::string {
  // Don't optimize the "{}" case to keep the binary size small and because it
  // can be better optimized in fmt::format anyway.
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  return to_string(buffer);
}